

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

String * __thiscall
indigox::utils::randomString_abi_cxx11_(String *__return_storage_ptr__,utils *this,size_t length)

{
  uint uVar1;
  int iVar2;
  utils *puVar3;
  random_device local_13b0;
  
  if (randomString[abi:cxx11](unsigned_long)::rg == '\0') {
    iVar2 = __cxa_guard_acquire(&randomString[abi:cxx11](unsigned_long)::rg);
    if (iVar2 != 0) {
      std::random_device::random_device(&local_13b0);
      uVar1 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&randomString::rg,(ulong)uVar1);
      std::random_device::~random_device(&local_13b0);
      __cxa_guard_release(&randomString[abi:cxx11](unsigned_long)::rg);
    }
  }
  if (randomString[abi:cxx11](unsigned_long)::pick == '\0') {
    iVar2 = __cxa_guard_acquire(&randomString[abi:cxx11](unsigned_long)::pick);
    if (iVar2 != 0) {
      randomString::pick._M_param._M_a = 0;
      randomString::pick._M_param._M_b = 0x33;
      __cxa_guard_release(&randomString[abi:cxx11](unsigned_long)::pick);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar3 = this + 1;
  while (puVar3 = puVar3 + -1, puVar3 != (utils *)0x0) {
    std::uniform_int_distribution<unsigned_long>::operator()(&randomString::pick,&randomString::rg);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String randomString(size_t length) {
      static auto& chrs = "qwertyuiopasdfghjklzxcvbnmZAQXSWCDEVFRBGTNHYMJUKILOP";
      
      static std::mt19937 rg{std::random_device{}()};
      static std::uniform_int_distribution<size_t> pick(0, sizeof(chrs) - 2);
      
      String s;
      s.reserve(length + 4);  // no need to copy when adding extensions
      
      while(length--)
        s += chrs[pick(rg)];
      return s;
      
    }